

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncError asciiToAscii(void *vctxt,uchar *out,int *poutlen,uchar *in,int *pinlen,int flush)

{
  xmlCharEncError xVar1;
  xmlCharEncError xVar2;
  xmlCharEncError xVar3;
  long lVar4;
  xmlCharEncError xVar5;
  long lVar6;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    return XML_ENC_ERR_SUCCESS;
  }
  xVar1 = *pinlen;
  xVar2 = *poutlen;
  xVar3 = xVar2;
  if (xVar1 <= xVar2) {
    xVar3 = xVar1;
  }
  xVar5 = XML_ENC_ERR_SPACE;
  if (xVar1 <= xVar2) {
    xVar5 = xVar1;
  }
  *poutlen = xVar3;
  *pinlen = xVar3;
  if (XML_ENC_ERR_SUCCESS < xVar3) {
    lVar6 = 0;
    do {
      if ((char)in[lVar6] < '\0') {
        *poutlen = (int)lVar6;
        *pinlen = (int)lVar6;
        return XML_ENC_ERR_INPUT;
      }
      out[lVar6] = in[lVar6];
      lVar4 = lVar6 + 1;
      lVar6 = lVar6 + 1;
    } while (in + lVar4 < in + xVar3);
  }
  return xVar5;
}

Assistant:

static xmlCharEncError
asciiToAscii(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}